

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxwrapper_opengl.c
# Opt level: O2

ksGpuSurfaceBits
ksGpuContext_BitsForSurfaceFormat
          (ksGpuSurfaceColorFormat colorFormat,ksGpuSurfaceDepthFormat depthFormat)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  
  bVar1 = 8;
  bVar2 = 8;
  bVar3 = 8;
  if ((colorFormat & ~KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) != KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8) {
    if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5) {
      bVar2 = 6;
      bVar1 = 5;
      bVar3 = 0;
    }
    else {
      bVar6 = colorFormat != KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5;
      bVar1 = bVar6 * '\x03' + 5;
      bVar2 = bVar6 * '\x02' + 6;
      bVar3 = bVar6 << 3;
    }
  }
  uVar5 = 0x180000000000;
  if (depthFormat != KS_GPU_SURFACE_DEPTH_FORMAT_D24) {
    uVar5 = 0;
  }
  uVar4 = 0x100000000000;
  if (depthFormat != KS_GPU_SURFACE_DEPTH_FORMAT_D16) {
    uVar4 = uVar5;
  }
  return (ksGpuSurfaceBits)
         ((uint6)bVar2 << 8 |
          (uint6)bVar1 << 0x10 |
          (uint6)bVar3 << 0x18 |
          (uint6)(byte)(bVar2 + bVar3 + bVar1 * '\x02') << 0x20 | (uint6)uVar4 | (uint6)bVar1);
}

Assistant:

ksGpuSurfaceBits ksGpuContext_BitsForSurfaceFormat(const ksGpuSurfaceColorFormat colorFormat,
                                                   const ksGpuSurfaceDepthFormat depthFormat) {
    ksGpuSurfaceBits bits;
    bits.redBits = ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8)
                        ? 8
                        : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8)
                               ? 8
                               : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5)
                                      ? 5
                                      : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) ? 5 : 8))));
    bits.greenBits = ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8)
                          ? 8
                          : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8)
                                 ? 8
                                 : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5)
                                        ? 6
                                        : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) ? 6 : 8))));
    bits.blueBits = ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8)
                         ? 8
                         : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8)
                                ? 8
                                : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5)
                                       ? 5
                                       : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) ? 5 : 8))));
    bits.alphaBits = ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8)
                          ? 8
                          : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8)
                                 ? 8
                                 : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5)
                                        ? 0
                                        : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) ? 0 : 8))));
    bits.colorBits = bits.redBits + bits.greenBits + bits.blueBits + bits.alphaBits;
    bits.depthBits =
        ((depthFormat == KS_GPU_SURFACE_DEPTH_FORMAT_D16) ? 16 : ((depthFormat == KS_GPU_SURFACE_DEPTH_FORMAT_D24) ? 24 : 0));
    return bits;
}